

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O0

void __thiscall
StrongConnectedComponents::makeAdjListSubgraph(StrongConnectedComponents *this,int node)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ESI;
  undefined8 *in_RDI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *unaff_retaddr;
  int currentNode;
  int j;
  int adjListOriginalISize;
  int i;
  int adjListSize;
  int local_1c;
  int iVar6;
  undefined8 *__new_size;
  
  __new_size = in_RDI;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x1d4f9f);
  sVar3 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)*in_RDI);
  iVar1 = (int)sVar3;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(unaff_retaddr,(size_type)__new_size);
  iVar6 = in_ESI;
  for (; in_ESI < iVar1; in_ESI = in_ESI + 1) {
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)*in_RDI,(long)in_ESI);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
    iVar2 = (int)sVar3;
    for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)*in_RDI,(long)in_ESI);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_1c);
      if (iVar6 <= *pvVar5) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 1),(long)in_ESI);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar6,iVar1),
                   (value_type_conflict3 *)CONCAT44(in_ESI,iVar2));
      }
    }
  }
  return;
}

Assistant:

void StrongConnectedComponents::makeAdjListSubgraph(const int node) {
    adjList.clear();
    const int adjListSize = adjListOriginal.size();
    adjList.resize(adjListSize);

    for (int i = node; i < adjListSize; i++) {
        const int adjListOriginalISize = adjListOriginal[i].size();
        for (int j = 0; j < adjListOriginalISize; j++) {
            const int currentNode = adjListOriginal[i][j];
            if (currentNode >= node) {
                adjList[i].push_back(currentNode);
            }
        }
    }
}